

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall duckdb::roaring::RoaringAnalyzeState::FlushSegment(RoaringAnalyzeState *this)

{
  idx_t iVar1;
  idx_t iVar2;
  
  if (this->current_count != 0) {
    iVar1 = this->metadata_size;
    iVar2 = this->data_size;
    (this->metadata_collection).arrays_in_segment = 0;
    (this->metadata_collection).count_in_segment = 0;
    (this->metadata_collection).runs_in_segment = 0;
    this->total_size = this->total_size + iVar1 + iVar2;
    this->current_count = 0;
    this->data_size = 0;
    this->metadata_size = 0;
    this->segment_count = this->segment_count + 1;
  }
  return;
}

Assistant:

void RoaringAnalyzeState::FlushSegment() {
	auto space_used = data_size + metadata_size;
	if (!current_count) {
		D_ASSERT(!space_used);
		return;
	}
	metadata_collection.FlushSegment();
	total_size += space_used;
	data_size = 0;
	metadata_size = 0;
	current_count = 0;
	segment_count++;
}